

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O3

int * Hsh_IntManLookup(Hsh_IntMan_t *p,uint *pData)

{
  byte *pbVar1;
  int iVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  
  iVar2 = p->nSize;
  uVar5 = p->vTable->nSize;
  if (iVar2 * 4 == 0) {
    uVar8 = 0;
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    do {
      pbVar1 = (byte *)((long)pData + uVar7);
      uVar7 = uVar7 + 1;
      uVar8 = (*pbVar1 + uVar8) * 0x401;
      uVar8 = uVar8 >> 6 ^ uVar8;
    } while ((uint)(iVar2 * 4) != uVar7);
    uVar8 = uVar8 * 9;
  }
  uVar7 = (ulong)((uVar8 >> 0xb ^ uVar8) * 0x8001) % (ulong)uVar5;
  iVar6 = (int)uVar7;
  if ((-1 < iVar6) && (iVar6 < (int)uVar5)) {
    puVar9 = (uint *)(p->vTable->pArray + uVar7);
    uVar5 = *puVar9;
    if (uVar5 != 0xffffffff) {
      pVVar3 = p->vObjs;
      do {
        if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar4 = pVVar3->pArray;
        if (pwVar4 == (word *)0x0) {
          __assert_fail("*pPlace == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHsh.h"
                        ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
        }
        pwVar4 = pwVar4 + uVar5;
        uVar5 = (int)*pwVar4 * iVar2;
        if (((int)uVar5 < 0) || (p->vData->nSize <= (int)uVar5)) goto LAB_00891371;
        iVar6 = bcmp(pData,p->vData->pArray + uVar5,(long)iVar2 * 4);
        if (iVar6 == 0) {
          return (int *)puVar9;
        }
        uVar5 = *(uint *)((long)pwVar4 + 4);
        puVar9 = (uint *)((long)pwVar4 + 4);
      } while (uVar5 != 0xffffffff);
    }
    return (int *)puVar9;
  }
LAB_00891371:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int * Hsh_IntManLookup( Hsh_IntMan_t * p, unsigned * pData )
{
    Hsh_IntObj_t * pObj;
    int * pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(pData, p->nSize, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_IntObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( !memcmp( pData, Hsh_IntData(p, pObj->iData), sizeof(int) * (size_t)p->nSize ) )
            return pPlace;
    assert( *pPlace == -1 );
    return pPlace;
}